

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O1

bool DirImage(string *path)

{
  bool bVar1;
  shared_ptr<Disk> disk;
  undefined1 local_21;
  shared_ptr<Disk> local_20;
  
  local_20.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Disk *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Disk,std::allocator<Disk>>
            (&local_20.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&local_20,(allocator<Disk> *)&local_21);
  bVar1 = ReadImage(path,&local_20,true);
  if (bVar1) {
    bVar1 = Dir(local_20.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  else {
    bVar1 = false;
  }
  if (local_20.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool DirImage(const std::string& path)
{
    auto disk = std::make_shared<Disk>();
    return ReadImage(path, disk) && Dir(*disk);
}